

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaGetCanonValue(xmlSchemaValPtr val,xmlChar **retValue)

{
  ushort uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  xmlChar *pxVar8;
  xmlSchemaValPtr value;
  uint uVar9;
  long lVar10;
  char *__format;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  short sVar16;
  ushort uVar17;
  xmlChar *__s;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  xmlChar *__src;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  size_t __maxlen;
  unsigned_long uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  char buf [30];
  
  if (val == (xmlSchemaValPtr)0x0 || retValue == (xmlChar **)0x0) {
    return -1;
  }
  *retValue = (xmlChar *)0x0;
  switch(val->type) {
  case XML_SCHEMAS_STRING:
    pcVar13 = (char *)(val->value).qname.name;
    if ((xmlChar *)pcVar13 == (xmlChar *)0x0) {
LAB_001c4c2d:
      pcVar13 = "";
    }
    break;
  case XML_SCHEMAS_NORMSTRING:
    pxVar8 = (val->value).qname.name;
    if (pxVar8 == (xmlChar *)0x0) goto LAB_001c4c2d;
    pxVar8 = xmlSchemaWhiteSpaceReplace(pxVar8);
    goto LAB_001c46ff;
  case XML_SCHEMAS_DECIMAL:
    uVar1 = *(ushort *)((long)&val->value + 0x1c);
    uVar2 = (val->value).decimal.lo;
    if (uVar2 != 0 || (uVar1 & 0xff00) != 0x100) {
      uVar29 = (val->value).decimal.mi;
      uVar3 = (val->value).decimal.hi;
      uVar4 = uVar1 >> 8;
      uVar18 = (uint)uVar4;
      uVar5 = uVar1 >> 1;
      uVar9 = uVar5 & 0x7f;
      uVar17 = (ushort)uVar9;
      sVar14 = (ulong)((uVar1 & 1) + uVar18) + (ulong)(uVar17 == uVar4 || (uVar5 & 0x7f) == 0) + 2;
      pxVar8 = (xmlChar *)(*xmlMalloc)(sVar14);
      if (pxVar8 == (xmlChar *)0x0) {
        return -1;
      }
      __s = pxVar8;
      if ((uVar1 & 1) != 0) {
        __s = pxVar8 + 1;
        *pxVar8 = '-';
      }
      if (uVar17 == uVar4) {
        __s[0] = '0';
        __s[1] = '.';
        __s = __s + 2;
      }
      if (uVar3 == 0) {
        if (uVar29 == 0) {
          snprintf((char *)__s,(size_t)(pxVar8 + (sVar14 - (long)__s)),"%lu",uVar2);
        }
        else {
          snprintf((char *)__s,(size_t)(pxVar8 + (sVar14 - (long)__s)),"%lu%lu",uVar29,uVar2);
        }
      }
      else {
        snprintf((char *)__s,(size_t)(pxVar8 + (sVar14 - (long)__s)),"%lu%lu%lu",uVar3,uVar29);
      }
      if ((uVar5 & 0x7f) == 0) {
        __src = pxVar8 + (sVar14 - 3);
        (pxVar8 + (sVar14 - 2))[0] = '0';
        (pxVar8 + (sVar14 - 2))[1] = '\0';
LAB_001c4fab:
        *__src = '.';
      }
      else {
        if (uVar17 != uVar4) {
          __src = __s + (int)(uVar18 - uVar9);
          memmove(__s + (long)(int)(uVar18 - uVar9) + 1,__src,(ulong)(uVar9 + 1));
          goto LAB_001c4fab;
        }
        uVar20 = 0xffffffffffffffff;
        do {
          iVar6 = (int)uVar20;
          uVar9 = iVar6 + 1;
          uVar20 = (ulong)uVar9;
        } while (__s[uVar20] != '\0');
        uVar19 = uVar18 - uVar9;
        if (uVar9 <= uVar18 && uVar19 != 0) {
          memmove(__s + uVar19,__s,(ulong)(iVar6 + 2));
          memset(__s,0x30,(ulong)uVar19);
        }
      }
      *retValue = pxVar8;
      goto LAB_001c4edf;
    }
    pcVar13 = "0.0";
    break;
  case XML_SCHEMAS_TIME:
    if ((*(byte *)((long)&val->value + 0x18) & 1) == 0) {
      uVar9 = (val->value).hex.total;
      snprintf(buf,0x1e,"%02u:%02u:%02.14g",(val->value).decimal.hi,(ulong)(uVar9 >> 9 & 0x1f),
               (ulong)(uVar9 >> 0xe & 0x3f));
    }
    else {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar9 = (value->value).hex.total;
      snprintf(buf,0x1e,"%02u:%02u:%02.14gZ",(value->value).decimal.hi,(ulong)(uVar9 >> 9 & 0x1f),
               (ulong)(uVar9 >> 0xe & 0x3f));
LAB_001c4e0b:
      xmlSchemaFreeValue(value);
    }
    goto LAB_001c4e65;
  case XML_SCHEMAS_GDAY:
    pxVar8 = (xmlChar *)(*xmlMalloc)(6);
    *retValue = pxVar8;
    if (pxVar8 == (xmlChar *)0x0) {
      return -1;
    }
    uVar9 = (val->value).hex.total >> 4 & 0x1f;
    pcVar13 = "---%02u";
    goto LAB_001c4abd;
  case XML_SCHEMAS_GMONTH:
    pxVar8 = (xmlChar *)(*xmlMalloc)(6);
    *retValue = pxVar8;
    if (pxVar8 == (xmlChar *)0x0) {
      return -1;
    }
    uVar9 = (val->value).hex.total & 0xf;
    pcVar13 = "--%02u";
LAB_001c4abd:
    snprintf((char *)pxVar8,6,pcVar13,(ulong)uVar9);
    goto LAB_001c4edf;
  case XML_SCHEMAS_GMONTHDAY:
    pxVar8 = (xmlChar *)(*xmlMalloc)(8);
    *retValue = pxVar8;
    if (pxVar8 == (xmlChar *)0x0) {
      return -1;
    }
    uVar9 = (val->value).hex.total;
    snprintf((char *)pxVar8,8,"--%02u-%02u",(ulong)(uVar9 & 0xf),(ulong)(uVar9 >> 4 & 0x1f));
    goto LAB_001c4edf;
  case XML_SCHEMAS_GYEAR:
    snprintf(buf,0x1e,"%04ld",(val->value).decimal.lo);
    goto LAB_001c4bf7;
  case XML_SCHEMAS_GYEARMONTH:
    lVar10 = (val->value).date.year;
    if (lVar10 < 0) {
      lVar10 = -lVar10;
      uVar9 = (val->value).hex.total;
      pcVar13 = "-%04ld-%02u";
    }
    else {
      uVar9 = (val->value).hex.total;
      pcVar13 = "%04ld-%02u";
    }
    snprintf(buf,0x23,pcVar13,lVar10,(ulong)(uVar9 & 0xf));
    goto LAB_001c4e65;
  case XML_SCHEMAS_DATE:
    if ((*(byte *)((long)&val->value + 0x18) & 1) != 0) {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar9 = (value->value).hex.total;
      snprintf(buf,0x1e,"%04ld-%02u-%02uZ",(value->value).decimal.lo,(ulong)(uVar9 & 0xf),
               (ulong)(uVar9 >> 4 & 0x1f));
      goto LAB_001c4e0b;
    }
    uVar9 = (val->value).hex.total;
    snprintf(buf,0x1e,"%04ld-%02u-%02u",(val->value).decimal.lo,(ulong)(uVar9 & 0xf),
             (ulong)(uVar9 >> 4 & 0x1f));
    goto LAB_001c4e65;
  case XML_SCHEMAS_DATETIME:
    if ((*(byte *)((long)&val->value + 0x18) & 1) != 0) {
      value = xmlSchemaDateNormalize(val,0.0);
      if (value == (xmlSchemaValPtr)0x0) {
        return -1;
      }
      uVar9 = (value->value).hex.total;
      snprintf(buf,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",(value->value).decimal.hi,
               (value->value).decimal.lo,(ulong)(uVar9 & 0xf),(ulong)(uVar9 >> 4 & 0x1f),
               (ulong)(uVar9 >> 9 & 0x1f),(ulong)(uVar9 >> 0xe & 0x3f));
      goto LAB_001c4e0b;
    }
    uVar9 = (val->value).hex.total;
    snprintf(buf,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14g",(val->value).decimal.hi,
             (val->value).decimal.lo,(ulong)(uVar9 & 0xf),(ulong)(uVar9 >> 4 & 0x1f),
             (ulong)(uVar9 >> 9 & 0x1f),(ulong)(uVar9 >> 0xe & 0x3f));
LAB_001c4e65:
    pcVar13 = buf;
    break;
  case XML_SCHEMAS_DURATION:
    lVar10 = (val->value).date.year;
    lVar11 = -lVar10;
    if (0 < lVar10) {
      lVar11 = lVar10;
    }
    dVar24 = floor((double)lVar11 / 12.0);
    uVar21 = (long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24;
    dVar24 = (val->value).date.sec;
    uVar31 = 0;
    dVar28 = ABS(dVar24);
    uVar30 = 0;
    dVar22 = floor(dVar28 / 86400.0);
    uVar20 = (long)dVar22 >> 0x3f & (long)(dVar22 - 9.223372036854776e+18) | (long)dVar22;
    lVar7 = uVar20 * 0x15180;
    auVar25._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar25._0_8_ = lVar7;
    auVar25._12_4_ = 0x45300000;
    dVar22 = dVar28 - ((auVar25._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    if (dVar22 <= 0.0) {
      uVar12 = 0;
      uVar15 = 0;
      dVar23 = 0.0;
      dVar22 = dVar28;
    }
    else {
      dVar28 = floor(dVar22 / 3600.0);
      uVar12 = (long)(dVar28 - 9.223372036854776e+18) & (long)dVar28 >> 0x3f | (long)dVar28;
      lVar7 = uVar12 * 0xe10;
      auVar26._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar26._0_8_ = lVar7;
      auVar26._12_4_ = 0x45300000;
      dVar28 = dVar22 - ((auVar26._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
      dVar23 = 0.0;
      if (dVar28 <= 0.0) {
        uVar15 = 0;
      }
      else {
        dVar22 = floor(dVar28 / 60.0);
        uVar15 = (long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22;
        lVar7 = uVar15 * 0x3c;
        auVar27._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar27._0_8_ = lVar7;
        auVar27._12_4_ = 0x45300000;
        dVar23 = dVar28 - ((auVar27._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
        dVar22 = dVar28;
      }
    }
    __format = "-P%luY%luM%luDT%luH%luM%.14gS";
    if (dVar24 < 0.0) {
      __format = "P%luY%luM%luDT%luH%luM%.14gS";
    }
    if (lVar10 < 0) {
      __format = "P%luY%luM%luDT%luH%luM%.14gS";
    }
    pcVar13 = buf;
    snprintf(pcVar13,100,__format,dVar23,uVar21,uVar21 * -0xc + lVar11,uVar20,uVar12,uVar15,dVar22,
             uVar30,dVar24,uVar31);
    break;
  case XML_SCHEMAS_FLOAT:
    dVar24 = (double)(val->value).f;
    __maxlen = 0x1e;
    goto LAB_001c4bec;
  case XML_SCHEMAS_DOUBLE:
    dVar24 = (double)(val->value).decimal.lo;
    __maxlen = 0x28;
LAB_001c4bec:
    snprintf(buf,__maxlen,"%01.14e",dVar24);
LAB_001c4bf7:
    pcVar13 = buf;
    break;
  case XML_SCHEMAS_BOOLEAN:
    if ((val->value).b == 0) {
      pcVar13 = "false";
    }
    else {
      pcVar13 = "true";
    }
    break;
  case XML_SCHEMAS_TOKEN:
  case XML_SCHEMAS_LANGUAGE:
  case XML_SCHEMAS_NMTOKEN:
  case XML_SCHEMAS_NAME:
  case XML_SCHEMAS_NCNAME:
  case XML_SCHEMAS_ID:
  case XML_SCHEMAS_IDREF:
  case XML_SCHEMAS_ENTITY:
  case XML_SCHEMAS_NOTATION:
  case XML_SCHEMAS_ANYURI:
    pxVar8 = (val->value).qname.name;
    if (pxVar8 == (xmlChar *)0x0) {
      return -1;
    }
    pxVar8 = xmlSchemaCollapseString(pxVar8);
LAB_001c46ff:
    *retValue = pxVar8;
    if (pxVar8 != (xmlChar *)0x0) goto LAB_001c4edf;
switchD_001c46ba_caseD_2b:
    pcVar13 = (char *)(val->value).qname.name;
    break;
  default:
    pxVar8 = xmlStrdup((xmlChar *)"???");
    *retValue = pxVar8;
    return 1;
  case XML_SCHEMAS_QNAME:
    if ((val->value).decimal.mi == 0) {
      pxVar8 = xmlStrdup((val->value).qname.name);
      *retValue = pxVar8;
      return 0;
    }
    pxVar8 = xmlStrdup((xmlChar *)"{");
    *retValue = pxVar8;
    pxVar8 = xmlStrcat(pxVar8,(val->value).qname.uri);
    *retValue = pxVar8;
    pxVar8 = xmlStrcat(pxVar8,"}");
    *retValue = pxVar8;
    pxVar8 = xmlStrcat(pxVar8,(val->value).qname.uri);
    goto LAB_001c4edc;
  case XML_SCHEMAS_INTEGER:
  case XML_SCHEMAS_NPINTEGER:
  case XML_SCHEMAS_NINTEGER:
  case XML_SCHEMAS_NNINTEGER:
  case XML_SCHEMAS_PINTEGER:
  case XML_SCHEMAS_INT:
  case XML_SCHEMAS_UINT:
  case XML_SCHEMAS_LONG:
  case XML_SCHEMAS_ULONG:
  case XML_SCHEMAS_SHORT:
  case XML_SCHEMAS_USHORT:
  case XML_SCHEMAS_BYTE:
  case XML_SCHEMAS_UBYTE:
    uVar1 = *(ushort *)((long)&val->value + 0x1c);
    uVar2 = (val->value).decimal.lo;
    if (uVar2 != 0 || (uVar1 & 0xff00) != 0x100) {
      uVar29 = (val->value).decimal.mi;
      uVar3 = (val->value).decimal.hi;
      uVar20 = (ulong)((uint)(uVar1 >> 8) + (uVar1 & 1) + 1);
      pxVar8 = (xmlChar *)(*xmlMalloc)(uVar20);
      *retValue = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        return -1;
      }
      sVar16 = (short)(uVar1 & 1);
      if (uVar3 == 0) {
        if (uVar29 == 0) {
          if (sVar16 == 0) {
            pcVar13 = "%lu";
          }
          else {
            pcVar13 = "-%lu";
          }
          snprintf((char *)pxVar8,uVar20,pcVar13,uVar2);
        }
        else {
          if (sVar16 == 0) {
            pcVar13 = "%lu%lu";
          }
          else {
            pcVar13 = "-%lu%lu";
          }
          snprintf((char *)pxVar8,uVar20,pcVar13,uVar29,uVar2);
        }
      }
      else {
        if (sVar16 == 0) {
          pcVar13 = "%lu%lu%lu";
        }
        else {
          pcVar13 = "-%lu%lu%lu";
        }
        snprintf((char *)pxVar8,uVar20,pcVar13,uVar3,uVar29,uVar2);
      }
      goto LAB_001c4edf;
    }
    pcVar13 = "0";
    break;
  case XML_SCHEMAS_HEXBINARY:
  case XML_SCHEMAS_BASE64BINARY:
    goto switchD_001c46ba_caseD_2b;
  }
  pxVar8 = xmlStrdup((xmlChar *)pcVar13);
LAB_001c4edc:
  *retValue = pxVar8;
LAB_001c4edf:
  return -(uint)(*retValue == (xmlChar *)0x0);
}

Assistant:

int
xmlSchemaGetCanonValue(xmlSchemaValPtr val, const xmlChar **retValue)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		*retValue = xmlSchemaWhiteSpaceReplace(
		    (const xmlChar *) val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(
			(const xmlChar *) val->value.str);
	    }
	    break;
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	case XML_SCHEMAS_NMTOKEN:
	case XML_SCHEMAS_NAME:
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_ID:
	case XML_SCHEMAS_IDREF:
	case XML_SCHEMAS_ENTITY:
	case XML_SCHEMAS_NOTATION: /* Unclear */
	case XML_SCHEMAS_ANYURI:   /* Unclear */
	    if (val->value.str == NULL)
		return (-1);
	    *retValue =
		BAD_CAST xmlSchemaCollapseString(BAD_CAST val->value.str);
	    if (*retValue == NULL)
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_QNAME:
	    /* TODO: Unclear in XML Schema 1.0. */
	    if (val->value.qname.uri == NULL) {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.qname.name);
		return (0);
	    } else {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "{");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST "}");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
	    }
	    break;
	case XML_SCHEMAS_DECIMAL:
	    /*
	    * TODO: Lookout for a more simple implementation.
	    */
	    if ((val->value.decimal.total == 1) &&
		(val->value.decimal.lo == 0)) {
		*retValue = xmlStrdup(BAD_CAST "0.0");
	    } else {
		xmlSchemaValDecimal dec = val->value.decimal;
		int bufsize;
		char *buf = NULL, *offs;

		/* Add room for the decimal point as well. */
		bufsize = dec.total + 2;
		if (dec.sign)
		    bufsize++;
		/* Add room for leading/trailing zero. */
		if ((dec.frac == 0) || (dec.frac == dec.total))
		    bufsize++;
		buf = xmlMalloc(bufsize);
		if (buf == NULL)
		    return(-1);
		offs = buf;
		if (dec.sign)
		    *offs++ = '-';
		if (dec.frac == dec.total) {
		    *offs++ = '0';
		    *offs++ = '.';
		}
		if (dec.hi != 0)
		    snprintf(offs, bufsize - (offs - buf),
			"%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		else if (dec.mi != 0)
		    snprintf(offs, bufsize - (offs - buf),
			"%lu%lu", dec.mi, dec.lo);
		else
		    snprintf(offs, bufsize - (offs - buf),
			"%lu", dec.lo);

		if (dec.frac != 0) {
		    if (dec.frac != dec.total) {
			int diff = dec.total - dec.frac;
			/*
			* Insert the decimal point.
			*/
			memmove(offs + diff + 1, offs + diff, dec.frac +1);
			offs[diff] = '.';
		    } else {
			unsigned int i = 0;
			/*
			* Insert missing zeroes behind the decimal point.
			*/
			while (*(offs + i) != 0)
			    i++;
			if (i < dec.total) {
			    memmove(offs + (dec.total - i), offs, i +1);
			    memset(offs, '0', dec.total - i);
			}
		    }
		} else {
		    /*
		    * Append decimal point and zero.
		    */
		    offs = buf + bufsize - 1;
		    *offs-- = 0;
		    *offs-- = '0';
		    *offs-- = '.';
		}
		*retValue = BAD_CAST buf;
	    }
	    break;
	case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
	case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_INT:
	case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_UBYTE:
	    if ((val->value.decimal.total == 1) &&
		(val->value.decimal.lo == 0))
		*retValue = xmlStrdup(BAD_CAST "0");
	    else {
		xmlSchemaValDecimal dec = val->value.decimal;
		int bufsize = dec.total + 1;

		/* Add room for the decimal point as well. */
		if (dec.sign)
		    bufsize++;
		*retValue = xmlMalloc(bufsize);
		if (*retValue == NULL)
		    return(-1);
		if (dec.hi != 0) {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize,
			    "-%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		    else
			snprintf((char *) *retValue, bufsize,
			    "%lu%lu%lu", dec.hi, dec.mi, dec.lo);
		} else if (dec.mi != 0) {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize,
			    "-%lu%lu", dec.mi, dec.lo);
		    else
			snprintf((char *) *retValue, bufsize,
			    "%lu%lu", dec.mi, dec.lo);
		} else {
		    if (dec.sign)
			snprintf((char *) *retValue, bufsize, "-%lu", dec.lo);
		    else
			snprintf((char *) *retValue, bufsize, "%lu", dec.lo);
		}
	    }
	    break;
	case XML_SCHEMAS_BOOLEAN:
	    if (val->value.b)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "true");
	    else
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "false");
	    break;
	case XML_SCHEMAS_DURATION: {
		char buf[100];
		unsigned long year;
		unsigned long mon, day, hour = 0, min = 0;
		double sec = 0, left;

		/* TODO: Unclear in XML Schema 1.0 */
		/*
		* TODO: This results in a normalized output of the value
		* - which is NOT conformant to the spec -
		* since the exact values of each property are not
		* recoverable. Think about extending the structure to
		* provide a field for every property.
		*/
		year = (unsigned long) FQUOTIENT(labs(val->value.dur.mon), 12);
		mon = labs(val->value.dur.mon) - 12 * year;

		day = (unsigned long) FQUOTIENT(fabs(val->value.dur.sec), 86400);
		left = fabs(val->value.dur.sec) - day * 86400;
		if (left > 0) {
		    hour = (unsigned long) FQUOTIENT(left, 3600);
		    left = left - (hour * 3600);
		    if (left > 0) {
			min = (unsigned long) FQUOTIENT(left, 60);
			sec = left - (min * 60);
		    }
		}
		if ((val->value.dur.mon < 0) || (val->value.dur.sec < 0))
		    snprintf(buf, 100, "P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		else
		    snprintf(buf, 100, "-P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GYEAR: {
		char buf[30];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		snprintf(buf, 30, "%04ld", val->value.date.year);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GMONTH: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "--%02u",
		    val->value.date.mon);
	    }
	    break;
        case XML_SCHEMAS_GDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "---%02u",
		    val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GMONTHDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(8);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 8, "--%02u-%02u",
		    val->value.date.mon, val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GYEARMONTH: {
		char buf[35];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		if (val->value.date.year < 0)
		    snprintf(buf, 35, "-%04ld-%02u",
			labs(val->value.date.year),
			val->value.date.mon);
		else
		    snprintf(buf, 35, "%04ld-%02u",
			val->value.date.year, val->value.date.mon);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_TIME:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 30,
			"%02u:%02u:%02.14gZ",
			norm->value.date.hour,
			norm->value.date.min,
			norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%02u:%02u:%02.14g",
			val->value.date.hour,
			val->value.date.min,
			val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATE:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Append the canonical value of the
		    * recoverable timezone and not "Z".
		    */
		    snprintf(buf, 30,
			"%04ld-%02u-%02uZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%04ld-%02u-%02u",
			val->value.date.year, val->value.date.mon,
			val->value.date.day);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATETIME:
	    {
		char buf[50];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day, norm->value.date.hour,
			norm->value.date.min, norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14g",
			val->value.date.year, val->value.date.mon,
			val->value.date.day, val->value.date.hour,
			val->value.date.min, val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_HEXBINARY:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.hex.str);
	    break;
	case XML_SCHEMAS_BASE64BINARY:
	    /*
	    * TODO: Is the following spec piece implemented?:
	    * SPEC: "Note: For some values the canonical form defined
	    * above does not conform to [RFC 2045], which requires breaking
	    * with linefeeds at appropriate intervals."
	    */
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.base64.str);
	    break;
	case XML_SCHEMAS_FLOAT: {
		char buf[30];
		/*
		* |m| < 16777216, -149 <= e <= 104.
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 30, "%01.14e", val->value.f);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_DOUBLE: {
		char buf[40];
		/* |m| < 9007199254740992, -1075 <= e <= 970 */
		/*
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 40, "%01.14e", val->value.d);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	default:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST "???");
	    return (1);
    }
    if (*retValue == NULL)
	return(-1);
    return (0);
}